

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O0

void __thiscall HighsHessian::clear(HighsHessian *this)

{
  undefined4 *in_RDI;
  uint in_stack_fffffffffffffff0;
  
  *in_RDI = 0;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x6b57e1);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x6b57ee);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x6b57fb);
  in_RDI[1] = 1;
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)(ulong)in_stack_fffffffffffffff0,(size_type)in_RDI
             ,(value_type_conflict2 *)0x6b5821);
  return;
}

Assistant:

void HighsHessian::clear() {
  this->dim_ = 0;
  this->start_.clear();
  this->index_.clear();
  this->value_.clear();
  this->format_ = HessianFormat::kTriangular;
  this->start_.assign(1, 0);
}